

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O3

interval_t duckdb::ToQuartersOperator::Operation<int,duckdb::interval_t>(int input)

{
  bool bVar1;
  OutOfRangeException *this;
  undefined1 auVar2 [12];
  int result;
  int32_t local_5c;
  string local_58;
  uint local_38 [4];
  
  bVar1 = TryCast::Operation<int,int>(input,&local_5c,false);
  if (!bVar1) {
    auVar2 = __cxa_allocate_exception(0x10);
    CastExceptionText<int,int>(&local_58,(duckdb *)(ulong)(uint)input,auVar2._8_4_);
    InvalidInputException::InvalidInputException(auVar2._0_8_,&local_58);
    __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryMultiplyOperator::Operation<int,int,int>(local_5c,3,(int32_t *)local_38);
  if (bVar1) {
    return (interval_t)ZEXT416(local_38[0]);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Interval value %d quarters out of range","");
  OutOfRangeException::OutOfRangeException<int>(this,&local_58,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_QUARTER,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d quarters out of range", input);
		}
		result.days = 0;
		result.micros = 0;
		return result;
	}